

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ConditionalBranchDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::ConditionalBranchDirectiveSyntax_const&>
          (BumpAllocator *this,ConditionalBranchDirectiveSyntax *args)

{
  ConditionalBranchDirectiveSyntax *this_00;
  
  this_00 = (ConditionalBranchDirectiveSyntax *)allocate(this,0x68,8);
  slang::syntax::ConditionalBranchDirectiveSyntax::ConditionalBranchDirectiveSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }